

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.hpp
# Opt level: O3

void __thiscall Omega_h::Graph::~Graph(Graph *this)

{
  int *piVar1;
  Alloc *pAVar2;
  
  pAVar2 = (this->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = (this->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      return;
    }
  }
  return;
}

Assistant:

OMEGA_H_INLINE Graph() {}